

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

arg_rex * arg_rexn(char *shortopts,char *longopts,char *pattern,char *datatype,int mincount,
                  int maxcount,int flags,char *glossary)

{
  arg_rex *paVar1;
  TRex *exp;
  ulong uVar2;
  char *local_40;
  char *local_38;
  
  local_40 = (char *)0x0;
  if (pattern == (char *)0x0) {
    puts("argtable: ERROR - illegal regular expression pattern \"(NULL)\"");
    puts("argtable: Bad argument table.");
  }
  else {
    if (maxcount <= mincount) {
      maxcount = mincount;
    }
    local_38 = longopts;
    paVar1 = (arg_rex *)malloc((long)maxcount * 8 + 0x80);
    if (paVar1 != (arg_rex *)0x0) {
      (paVar1->hdr).flag = '\x02';
      (paVar1->hdr).shortopts = shortopts;
      (paVar1->hdr).longopts = local_38;
      if (datatype == (char *)0x0) {
        datatype = pattern;
      }
      (paVar1->hdr).datatype = datatype;
      (paVar1->hdr).glossary = glossary;
      (paVar1->hdr).mincount = mincount;
      (paVar1->hdr).maxcount = maxcount;
      (paVar1->hdr).parent = paVar1;
      (paVar1->hdr).resetfn = arg_rex_resetfn;
      (paVar1->hdr).scanfn = arg_rex_scanfn;
      (paVar1->hdr).checkfn = arg_rex_checkfn;
      (paVar1->hdr).errorfn = arg_rex_errorfn;
      (paVar1->hdr).priv = paVar1 + 1;
      *(char **)&paVar1[1].hdr = pattern;
      *(int *)&paVar1[1].hdr.shortopts = flags;
      paVar1->sval = &paVar1[1].hdr.longopts;
      paVar1->count = 0;
      if (0 < maxcount) {
        uVar2 = 0;
        do {
          paVar1->sval[uVar2] = "";
          uVar2 = uVar2 + 1;
        } while ((uint)maxcount != uVar2);
      }
      exp = trex_compile(*(char **)&paVar1[1].hdr,&local_40,flags);
      if (exp == (TRex *)0x0) {
        arg_rexn_cold_1();
      }
      trex_free(exp);
      return paVar1;
    }
  }
  return (arg_rex *)0x0;
}

Assistant:

struct arg_rex * arg_rexn(const char * shortopts,
						  const char * longopts,
						  const char * pattern,
						  const char * datatype,
						  int mincount,
						  int maxcount,
						  int flags,
						  const char * glossary) {
	size_t nbytes;
	struct arg_rex * result;
	struct privhdr * priv;
	int i;
	const TRexChar * error = NULL;
	TRex * rex = NULL;

	if (!pattern) {
		printf(
			"argtable: ERROR - illegal regular expression pattern \"(NULL)\"\n");
		printf("argtable: Bad argument table.\n");
		return NULL;
	}

	/* foolproof things by ensuring maxcount is not less than mincount */
	maxcount = (maxcount < mincount) ? mincount : maxcount;

	nbytes = sizeof(struct arg_rex)       /* storage for struct arg_rex */
			 + sizeof(struct privhdr)     /* storage for private arg_rex data */
			 + maxcount * sizeof(char *);  /* storage for sval[maxcount] array */

	result = (struct arg_rex *)malloc(nbytes);

	if (result == NULL) {
		return result;
	}

	/* init the arg_hdr struct */
	result->hdr.flag      = ARG_HASVALUE;
	result->hdr.shortopts = shortopts;
	result->hdr.longopts  = longopts;
	result->hdr.datatype  = datatype ? datatype : pattern;
	result->hdr.glossary  = glossary;
	result->hdr.mincount  = mincount;
	result->hdr.maxcount  = maxcount;
	result->hdr.parent    = result;
	result->hdr.resetfn   = (arg_resetfn *)arg_rex_resetfn;
	result->hdr.scanfn    = (arg_scanfn *)arg_rex_scanfn;
	result->hdr.checkfn   = (arg_checkfn *)arg_rex_checkfn;
	result->hdr.errorfn   = (arg_errorfn *)arg_rex_errorfn;

	/* store the arg_rex_priv struct immediately after the arg_rex struct */
	result->hdr.priv  = result + 1;
	priv = (struct privhdr *)(result->hdr.priv);
	priv->pattern = pattern;
	priv->flags = flags;

	/* store the sval[maxcount] array immediately after the arg_rex_priv struct */
	result->sval  = (const char * *)(priv + 1);
	result->count = 0;

	/* foolproof the string pointers by initializing them to reference empty strings */
	for (i = 0; i < maxcount; i++) {
		result->sval[i] = "";
	}

	/* here we construct and destroy a regex representation of the regular
	 * expression for no other reason than to force any regex errors to be
	 * trapped now rather than later. If we don't, then errors may go undetected
	 * until an argument is actually parsed.
	 */

	rex = trex_compile(priv->pattern, &error, priv->flags);

	if (rex == NULL) {
		ARG_LOG(("argtable: %s \"%s\"\n", error ? error : _TREXC("undefined"), priv->pattern));
		ARG_LOG(("argtable: Bad argument table.\n"));
	}

	trex_free(rex);

	ARG_TRACE(("arg_rexn() returns %p\n", result));
	return result;
}